

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

int * __thiscall
sisl::cartesian_cubic<int>::operator()(cartesian_cubic<int> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  bool bVar2;
  uint *local_80;
  uint *local_68;
  uint local_4c;
  uint local_48;
  int local_44;
  int *local_40;
  int *__hack;
  uint local_30;
  uint _z;
  uint _y;
  uint _x;
  __va_list_tag *vl_local;
  cartesian_cubic<int> *pcStack_18;
  int d0_local;
  cartesian_cubic<int> *this_local;
  
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_68 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_68 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_68 + 2;
  }
  local_48 = *local_68;
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_80 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_80 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_80 + 2;
  }
  local_4c = *local_80;
  local_40 = &this->__zero;
  *local_40 = 0;
  local_44 = d0;
  __hack._4_4_ = local_4c;
  local_30 = local_48;
  _z = d0;
  __y = vl;
  vl_local._4_4_ = d0;
  pcStack_18 = this;
  bVar2 = in_bound(this,&local_44,(int *)&local_48,(int *)&local_4c);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    this_local = (cartesian_cubic<int> *)
                 array_n<int,_3,_std::allocator<int>_>::operator()
                           (&this->_array,_z,(ulong)local_30,(ulong)__hack._4_4_);
  }
  else {
    this_local = (cartesian_cubic<int> *)&this->__zero;
  }
  return (int *)this_local;
}

Assistant:

virtual const T& operator()(int d0, va_list vl) const {
            unsigned int _x = d0, _y = 0, _z = 0;
            _y = va_arg(vl, unsigned int);
            _z = va_arg(vl, unsigned int);
            T *__hack = (T *)&__zero; *__hack = 0;

            if(!in_bound(_x, _y, _z)) return __zero;
            return _array(_x, _y, _z);
        }